

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsLib.cpp
# Opt level: O2

bool bhf::ads::PrependUdpTag(Frame *frame,string *value,uint16_t tagId)

{
  ulong uVar1;
  uint uVar2;
  ostream *poVar3;
  string sStack_1c8;
  stringstream stream;
  ostream local_198 [376];
  
  uVar1 = value->_M_string_length + 1;
  if (uVar1 < 0x10000) {
    uVar2 = (int)value->_M_string_length + 1;
    Frame::prepend(frame,(value->_M_dataplus)._M_p,(ulong)(uVar2 & 0xffff));
    PrependUdpLenTagId(frame,(uint16_t)uVar2,tagId);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar3 = std::operator<<(local_198,"PrependUdpTag");
    poVar3 = std::operator<<(poVar3,"(): value is too long, skipping tagId (");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,tagId);
    std::operator<<(poVar3,")\n");
    std::__cxx11::stringbuf::str();
    Logger::Log(2,&sStack_1c8);
    std::__cxx11::string::~string((string *)&sStack_1c8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  }
  return uVar1 < 0x10000;
}

Assistant:

static bool PrependUdpTag(Frame& frame, const std::string& value, const uint16_t tagId)
{
    if (value.length() + 1 > std::numeric_limits<uint16_t>::max()) {
        LOG_WARN(__FUNCTION__ << "(): value is too long, skipping tagId (" << std::dec << tagId << ")\n");
        return false;
    }
    const auto length = static_cast<uint16_t>(value.length() + 1);
    frame.prepend(value.data(), length);
    return PrependUdpLenTagId(frame, length, tagId);
}